

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O1

REF_STATUS ref_facelift_max_distance(REF_FACELIFT ref_facelift,REF_DBL *distance)

{
  double dVar1;
  int iVar2;
  REF_NODE pRVar3;
  REF_GEOM pRVar4;
  REF_GLOB *pRVar5;
  REF_DBL *pRVar6;
  REF_STATUS RVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  REF_DBL RVar12;
  
  if (ref_facelift->displacement == (REF_DBL *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x51f,"ref_facelift_max_distance","requires indirect facelift");
    RVar7 = 1;
  }
  else {
    pRVar3 = ref_facelift->grid->node;
    pRVar4 = ref_facelift->grid->geom;
    lVar8 = (long)pRVar3->max;
    if (0 < lVar8) {
      pRVar5 = pRVar3->global;
      lVar9 = 0;
      do {
        if (-1 < pRVar5[lVar9]) {
          distance[lVar9] = 0.0;
        }
        lVar9 = lVar9 + 1;
      } while (lVar8 != lVar9);
    }
    if (0 < pRVar4->max) {
      lVar8 = 0;
      lVar9 = 0;
      do {
        if (*(int *)((long)pRVar4->descr + lVar8) != -1) {
          iVar2 = *(int *)((long)pRVar4->descr + lVar8 + 0x14);
          dVar11 = distance[iVar2];
          pRVar6 = ref_facelift->displacement;
          dVar10 = *(double *)((long)pRVar6 + lVar8 + 8);
          dVar1 = *(double *)((long)pRVar6 + lVar8 + 0x10);
          dVar10 = dVar1 * dVar1 +
                   dVar10 * dVar10 +
                   *(double *)((long)pRVar6 + lVar8) * *(double *)((long)pRVar6 + lVar8);
          if (dVar10 < 0.0) {
            dVar10 = sqrt(dVar10);
          }
          else {
            dVar10 = SQRT(dVar10);
          }
          if (dVar11 <= dVar10) {
            pRVar6 = ref_facelift->displacement;
            dVar11 = *(double *)((long)pRVar6 + lVar8 + 8);
            dVar10 = *(double *)((long)pRVar6 + lVar8 + 0x10);
            dVar11 = dVar10 * dVar10 +
                     dVar11 * dVar11 +
                     *(double *)((long)pRVar6 + lVar8) * *(double *)((long)pRVar6 + lVar8);
            if (dVar11 < 0.0) {
              RVar12 = sqrt(dVar11);
            }
            else {
              RVar12 = SQRT(dVar11);
            }
          }
          else {
            RVar12 = distance[iVar2];
          }
          distance[iVar2] = RVar12;
        }
        lVar9 = lVar9 + 1;
        lVar8 = lVar8 + 0x18;
      } while (lVar9 < pRVar4->max);
    }
    RVar7 = 0;
  }
  return RVar7;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_max_distance(REF_FACELIFT ref_facelift,
                                             REF_DBL *distance) {
  REF_GRID ref_grid = ref_facelift_grid(ref_facelift);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_INT geom, node;

  RAS(!ref_facelift_direct(ref_facelift), "requires indirect facelift");

  each_ref_node_valid_node(ref_node, node) { distance[node] = 0.0; }

  each_ref_geom(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    distance[node] =
        MAX(distance[node], ref_facelift_distance(ref_facelift, geom));
  }

  return REF_SUCCESS;
}